

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitPop
          (Flow *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,Pop *curr)

{
  bool bVar1;
  byte bVar2;
  reference pvVar3;
  Type TVar4;
  undefined1 local_58 [8];
  value_type ret;
  Pop *curr_local;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  ret.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)curr;
  bVar1 = std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::empty(&this->multiValues);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!multiValues.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                  ,0x114d,
                  "Flow wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::visitPop(Pop *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                 );
  }
  pvVar3 = std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::back(&this->multiValues);
  Literals::Literals((Literals *)local_58,pvVar3);
  TVar4 = Literals::getType((Literals *)local_58);
  bVar2 = ::wasm::Type::isSubType
                    (TVar4,(Type)((ret.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0).
                                 func.super_IString.str._M_str);
  if ((bVar2 & 1) == 0) {
    __assert_fail("Type::isSubType(ret.getType(), curr->type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                  ,0x114f,
                  "Flow wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::visitPop(Pop *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                 );
  }
  std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::pop_back(&this->multiValues);
  Flow::Flow(__return_storage_ptr__,(Literals *)local_58);
  Literals::~Literals((Literals *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Flow visitPop(Pop* curr) {
    NOTE_ENTER("Pop");
    assert(!multiValues.empty());
    auto ret = multiValues.back();
    assert(Type::isSubType(ret.getType(), curr->type));
    multiValues.pop_back();
    return ret;
  }